

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

TypeRef __thiscall
clickhouse::Type::CreateEnum8
          (Type *this,
          vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>
          *enum_items)

{
  mapped_type mVar1;
  pointer pEVar2;
  Type *this_00;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int16_t *__k;
  pointer pEVar6;
  TypeRef TVar7;
  
  this_00 = (Type *)operator_new(0x10);
  Type(this_00,Enum8);
  *(Type **)this = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<clickhouse::Type*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_1,this_00);
  pEVar6 = (enum_items->
           super__Vector_base<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (enum_items->
           super__Vector_base<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Var5._M_pi = extraout_RDX;
  if (pEVar6 != pEVar2) {
    __k = &pEVar6->value;
    do {
      pmVar3 = std::
               map<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](*(map<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              **)(*(long *)this + 8),__k);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      mVar1 = *__k;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                             *)(*(long *)(*(long *)this + 8) + 0x30),(key_type *)(__k + -0x10));
      *pmVar4 = mVar1;
      pEVar6 = (pointer)(__k + 4);
      _Var5._M_pi = extraout_RDX_00;
      __k = __k + 0x14;
    } while (pEVar6 != pEVar2);
  }
  TVar7.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  TVar7.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TypeRef)TVar7.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Type::CreateEnum8(const std::vector<EnumItem>& enum_items) {
    TypeRef type(new Type(Type::Enum8));
    for (const auto& item : enum_items) {
        type->enum_->value_to_name[item.value] = item.name;
        type->enum_->name_to_value[item.name] = item.value;
    }
    return type;
}